

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  bool bVar1;
  InstOp IVar2;
  uint32_t uVar3;
  PatchList PVar4;
  Inst *pIVar5;
  Frag FVar6;
  ostream *poVar7;
  uint32_t in_ESI;
  long in_RDI;
  int out;
  int out1;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  PODArray<re2::Prog::Inst> *in_stack_fffffffffffffe20;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  LogMessage *in_stack_fffffffffffffe60;
  uint32_t local_14;
  Frag local_8;
  
  pIVar5 = PODArray<re2::Prog::Inst>::operator[]
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  IVar2 = Prog::Inst::opcode(pIVar5);
  uVar3 = in_ESI;
  if (IVar2 == kInstByteRange) {
    bVar1 = ByteRangeEqual((Compiler *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                           ,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (int)in_stack_fffffffffffffe28);
    if (bVar1) {
      Frag::Frag(&local_8,in_ESI,nullPatchList);
    }
    else {
      local_8 = NoMatch((Compiler *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  else {
    do {
      local_14 = uVar3;
      pIVar5 = PODArray<re2::Prog::Inst>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      IVar2 = Prog::Inst::opcode(pIVar5);
      if (IVar2 != kInstAlt) {
        this_00 = (LogMessage *)&stack0xfffffffffffffe50;
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
        poVar7 = LogMessage::stream(this_00);
        std::operator<<(poVar7,"should never happen");
        LogMessage::~LogMessage
                  ((LogMessage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        FVar6 = NoMatch((Compiler *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        return FVar6;
      }
      pIVar5 = PODArray<re2::Prog::Inst>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      Prog::Inst::out1(pIVar5);
      bVar1 = ByteRangeEqual((Compiler *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                             (int)in_stack_fffffffffffffe28);
      if (bVar1) {
        PVar4 = PatchList::Mk(local_14 << 1 | 1);
        Frag::Frag(&local_8,local_14,PVar4);
        return local_8;
      }
      if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
        FVar6 = NoMatch((Compiler *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        return FVar6;
      }
      pIVar5 = PODArray<re2::Prog::Inst>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      uVar3 = Prog::Inst::out(pIVar5);
      pIVar5 = PODArray<re2::Prog::Inst>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      IVar2 = Prog::Inst::opcode(pIVar5);
    } while (IVar2 == kInstAlt);
    bVar1 = ByteRangeEqual((Compiler *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                           ,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (int)in_stack_fffffffffffffe28);
    if (bVar1) {
      PVar4 = PatchList::Mk(local_14 << 1);
      Frag::Frag(&local_8,local_14,PVar4);
    }
    else {
      local_8 = NoMatch((Compiler *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  return local_8;
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}